

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::AddFunctions
          (BasicExprFactory<std::allocator<char>_> *this,int num_funcs)

{
  SafeInt<int> SVar1;
  AssertionFailure *this_00;
  SafeInt<int> local_1c;
  
  if (-1 < num_funcs) {
    SafeInt<int>::SafeInt<unsigned_long>
              (&local_1c,
               (long)(this->funcs_).
                     super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->funcs_).
                     super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    SVar1 = operator+(local_1c,num_funcs);
    std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::resize
              (&this->funcs_,(long)SVar1.value_);
    return;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid size");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void AddFunctions(int num_funcs) {
    MP_ASSERT(num_funcs >= 0, "invalid size");
    funcs_.resize(val(SafeInt<int>(funcs_.size()) + num_funcs));
  }